

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

uint_type __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
::getNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
           *this)

{
  undefined2 local_16;
  undefined2 local_14;
  int_type i;
  uint_type significand;
  int_type unbiased_exponent;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *this_local;
  
  local_16 = getUnbiasedNormalizedExponent(this);
  local_14 = getSignificandBits(this);
  for (; local_16 < -0xe; local_16 = local_16 + 1) {
    local_14 = local_14 << 1;
  }
  return local_14 & 0x3ff;
}

Assistant:

const uint_type getNormalizedSignificand() const {
    int_type unbiased_exponent = getUnbiasedNormalizedExponent();
    uint_type significand = getSignificandBits();
    for (int_type i = unbiased_exponent; i <= min_exponent; ++i) {
      significand = static_cast<uint_type>(significand << 1);
    }
    significand &= fraction_encode_mask;
    return significand;
  }